

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::AttributeLocationTestUtil::AttribType::AttribType
          (AttribType *this,string *name,deUint32 localSize,deUint32 typeEnum)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  this->m_locationSize = localSize;
  this->m_glTypeEnum = typeEnum;
  return;
}

Assistant:

AttribType::AttribType (const string& name, deUint32 localSize, deUint32 typeEnum)
	: m_name			(name)
	, m_locationSize	(localSize)
	, m_glTypeEnum		(typeEnum)
{
}